

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::Compaction::~Compaction(Compaction *this)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->input_version_ != (Version *)0x0) {
    Version::Unref(this->input_version_);
  }
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&(this->grandparents_).
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               );
  lVar2 = 0;
  do {
    std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
    ~_Vector_base((_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *
                  )((long)&this->inputs_[1].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x30);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    VersionEdit::~VersionEdit(&this->edit_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

Compaction::~Compaction() {
  if (input_version_ != nullptr) {
    input_version_->Unref();
  }
}